

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString StringFromBinaryWithSize(uchar *value,size_t size)

{
  ulong in_RDX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar1;
  SimpleString SVar2;
  SimpleString local_28;
  
  StringFromFormat((char *)value,"Size = %u | HexContents = ");
  StringFromBinaryOrNull((uchar *)&local_28,size);
  SimpleString::operator+=((SimpleString *)value,local_28.buffer_);
  SimpleString::~SimpleString(&local_28);
  sVar1 = extraout_RDX;
  if (0x80 < in_RDX) {
    SimpleString::operator+=((SimpleString *)value," ...");
    sVar1 = extraout_RDX_00;
  }
  SVar2.bufferSize_ = sVar1;
  SVar2.buffer_ = (char *)value;
  return SVar2;
}

Assistant:

SimpleString StringFromBinaryWithSize(const unsigned char* value, size_t size)
{
    SimpleString result = StringFromFormat("Size = %u | HexContents = ", (unsigned) size);
    size_t displayedSize = ((size > 128) ? 128 : size);
    result += StringFromBinaryOrNull(value, displayedSize);
    if (size > displayedSize)
    {
        result += " ...";
    }
    return result;
}